

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O3

void __thiscall bsplib::Rdma::ActionBuf::serialize(ActionBuf *this,A2A *a2a)

{
  int __fd;
  int __fd_00;
  int __fd_01;
  unsigned_long x;
  unsigned_long x_00;
  unsigned_long x_01;
  unsigned_long x_02;
  pointer pAVar1;
  ssize_t sVar2;
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  int in_R8D;
  ulong uVar3;
  int iVar4;
  long lVar5;
  Buffer buf;
  Buffer buf_1;
  Buffer buf_2;
  undefined1 local_3f [5];
  undefined1 local_3a [5];
  undefined1 local_35 [5];
  
  if (0 < a2a->m_nprocs) {
    lVar5 = 0;
    do {
      iVar4 = (int)lVar5;
      serial<unsigned_int>(a2a,iVar4,this->m_dummy_bsmp);
      serial<unsigned_long>
                (a2a,iVar4,
                 (this->m_get_buffer_offset).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5]);
      serial<unsigned_long>
                (a2a,iVar4,
                 (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < a2a->m_nprocs);
  }
  pAVar1 = (this->m_actions).
           super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_actions).
      super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar1) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      iVar4 = *(int *)((long)&pAVar1->target_pid + lVar5);
      __fd = *(int *)((long)&pAVar1->src_pid + lVar5);
      __fd_00 = *(int *)((long)&pAVar1->dst_pid + lVar5);
      __fd_01 = *(int *)((long)&pAVar1->tag + lVar5);
      x = *(unsigned_long *)((long)&pAVar1->src_slot + lVar5);
      x_00 = *(unsigned_long *)((long)&pAVar1->dst_slot + lVar5);
      x_01 = *(unsigned_long *)((long)&pAVar1->offset + lVar5);
      x_02 = *(unsigned_long *)((long)&pAVar1->size + lVar5);
      serial<unsigned_int>(a2a,iVar4,*(uint *)((long)&pAVar1->kind + lVar5));
      sVar2 = UIntSerialize<int>::write(__fd,local_3f,__n);
      A2A::send(a2a,iVar4,local_3f,(long)(int)sVar2,in_R8D);
      sVar2 = UIntSerialize<int>::write(__fd_00,local_3a,__n_00);
      A2A::send(a2a,iVar4,local_3a,(long)(int)sVar2,in_R8D);
      sVar2 = UIntSerialize<int>::write(__fd_01,local_35,__n_01);
      A2A::send(a2a,iVar4,local_35,(long)(int)sVar2,in_R8D);
      serial<unsigned_long>(a2a,iVar4,x);
      serial<unsigned_long>(a2a,iVar4,x_00);
      serial<unsigned_long>(a2a,iVar4,x_01);
      serial<unsigned_long>(a2a,iVar4,x_02);
      uVar3 = uVar3 + 1;
      pAVar1 = (this->m_actions).
               super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x38;
    } while (uVar3 < (ulong)(((long)(this->m_actions).
                                    super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 3)
                            * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void Rdma::ActionBuf::serialize( A2A & a2a ) 
{
    for (int p = 0; p < a2a.nprocs(); ++p ) {
        serial( a2a, p, m_dummy_bsmp );
        serial( a2a, p, m_get_buffer_offset[ p ] );
        serial( a2a, p, m_counts[ p ] );
    }

    for (size_t i = 0; i < m_actions.size(); ++i ) 
    {
        Action a = m_actions[i];
#ifdef PROFILE
        TicToc t( a.kind==Action::GET? TicToc::GET:
                  a.kind==Action::HPPUT? TicToc::HPPUT:
                  TicToc::HPGET );
        size_t start = a2a.send_size(a.target_pid);
#endif
        serial( a2a, a.target_pid, unsigned(a.kind) );
        serial( a2a, a.target_pid, a.src_pid );
        serial( a2a, a.target_pid, a.dst_pid );
        serial( a2a, a.target_pid, a.tag );
        serial( a2a, a.target_pid, a.src_slot );
        serial( a2a, a.target_pid, a.dst_slot );
        serial( a2a, a.target_pid, a.offset );
        serial( a2a, a.target_pid, a.size );
#ifdef PROFILE
        size_t end = a2a.send_size(a.target_pid);
        t.add_bytes(end-start);
#endif
    }
}